

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_getparam.c
# Opt level: O3

ParameterError
parse_header(GlobalConfig *global,OperationConfig *config,cmdline_t cmd,char *nextarg)

{
  bool bVar1;
  _Bool _Var2;
  ParameterError PVar3;
  ParameterError PVar4;
  FILE *__stream;
  char *ptr;
  curl_slist **list;
  _Bool error;
  dynbuf line;
  _Bool local_51;
  dynbuf local_50;
  
  if (*nextarg != '@') {
    if (cmd == C_PROXY_HEADER) {
      list = &config->proxyheaders;
    }
    else {
      list = &config->headers;
    }
    PVar4 = add2list(list,nextarg);
    return PVar4;
  }
  if ((nextarg[1] == '-') && (nextarg[2] == '\0')) {
    bVar1 = true;
    __stream = _stdin;
  }
  else {
    __stream = fopen64(nextarg + 1,"r");
    bVar1 = false;
  }
  if (__stream == (FILE *)0x0) {
    errorf(global,"Failed to open %s",nextarg + 1);
    PVar4 = PARAM_READ_ERROR;
  }
  else {
    local_51 = false;
    curlx_dyn_init(&local_50,0x19000);
    do {
      _Var2 = my_get_line((FILE *)__stream,&local_50,&local_51);
      if (!_Var2) {
        PVar3 = PARAM_OK;
        break;
      }
      ptr = curlx_dyn_ptr(&local_50);
      PVar3 = add2list(&config->headers + (cmd == C_PROXY_HEADER),ptr);
    } while (PVar3 == PARAM_OK);
    PVar4 = PARAM_READ_ERROR;
    if (local_51 == false) {
      PVar4 = PVar3;
    }
    curlx_dyn_free(&local_50);
    if (!bVar1) {
      fclose(__stream);
    }
  }
  return PVar4;
}

Assistant:

static ParameterError parse_header(struct GlobalConfig *global,
                                   struct OperationConfig *config,
                                   cmdline_t cmd,
                                   const char *nextarg)
{
  ParameterError err = PARAM_OK;

  /* A custom header to append to a list */
  if(nextarg[0] == '@') {
    /* read many headers from a file or stdin */
    bool use_stdin = !strcmp(&nextarg[1], "-");
    FILE *file = use_stdin ? stdin : fopen(&nextarg[1], FOPEN_READTEXT);
    if(!file) {
      errorf(global, "Failed to open %s", &nextarg[1]);
      err = PARAM_READ_ERROR;
    }
    else {
      struct dynbuf line;
      bool error = FALSE;
      curlx_dyn_init(&line, 1024*100);
      while(my_get_line(file, &line, &error)) {
        const char *ptr = curlx_dyn_ptr(&line);
        err = add2list(cmd == C_PROXY_HEADER ? /* --proxy-header? */
                       &config->proxyheaders :
                       &config->headers, ptr);
        if(err)
          break;
      }
      if(error)
        err = PARAM_READ_ERROR;
      curlx_dyn_free(&line);
      if(!use_stdin)
        fclose(file);
    }
  }
  else {
    if(cmd == C_PROXY_HEADER) /* --proxy-header */
      err = add2list(&config->proxyheaders, nextarg);
    else
      err = add2list(&config->headers, nextarg);
  }
  return err;
}